

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

void __thiscall Instance::enforceBoundaryConstraints(Instance *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ast aStack_38;
  
  uVar3 = 0;
  while( true ) {
    uVar2 = z3::ast_vector_tpl<z3::expr>::size(&this->borderVars);
    if (uVar2 <= uVar3) break;
    bVar1 = Graph::isBoundary(&this->graph,(int)uVar3);
    if (bVar1) {
      z3::ast_vector_tpl<z3::expr>::operator[]
                ((ast_vector_tpl<z3::expr> *)&aStack_38,(int)&this->borderVars);
      z3::optimize::add(&this->solver,(expr *)&aStack_38);
      z3::ast::~ast(&aStack_38);
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void Instance::enforceBoundaryConstraints() {
  for (size_t vertex = 0; vertex < borderVars.size(); vertex++) {
    if (graph.isBoundary(vertex)) {
      solver.add(borderVars[vertex]);
    }
  }
}